

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::TPZSkylMatrix
          (TPZSkylMatrix<std::complex<long_double>_> *this,
          TPZSkylMatrix<std::complex<long_double>_> *A)

{
  int64_t iVar1;
  char cVar2;
  
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBaseMatrix_01855230;
  iVar1 = (A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow =
       (A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol = iVar1;
  cVar2 = (A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDefPositive = cVar2;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZSkylMatrix_01853890;
  (this->fElem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01855478;
  (this->fElem).fStore = (complex<long_double> **)0x0;
  (this->fElem).fNElements = 0;
  (this->fElem).fNAlloc = 0;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  (this->fStorage).fStore = (complex<long_double> *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  Copy(this,A);
  return;
}

Assistant:

TPZSkylMatrix(const TPZSkylMatrix<TVar> &A ) : TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>(A), fElem(0), fStorage(0)  { Copy(A); }